

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O3

void __thiscall FileTree::FileTree(FileTree *this)

{
  TreeNode *pTVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  this->root = (TreeNode *)0x0;
  pTVar1 = (TreeNode *)operator_new(0x40);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/","");
  (pTVar1->value)._M_dataplus._M_p = (pointer)&(pTVar1->value).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pTVar1,local_38,local_38 + local_30);
  pTVar1->isFile = false;
  pTVar1->parent = (TreeNode *)0x0;
  pTVar1->firstChild = (TreeNode *)0x0;
  pTVar1->nextSibling = (TreeNode *)0x0;
  this->root = pTVar1;
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

FileTree()
    {
        root = new TreeNode("/", false);
    }